

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NVector_MultiFab.cpp
# Opt level: O2

int N_VConstrMask_MultiFab(N_Vector a,N_Vector x,N_Vector m)

{
  double dVar1;
  uint uVar2;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::FArrayBox> *this_00;
  MultiFab *this_01;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int j;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  Real RVar19;
  MFIter mfi;
  Box local_16c;
  Array4<double> local_150;
  Array4<double> local_110;
  Array4<double> local_d0;
  MFIter local_90;
  
  this = *(FabArray<amrex::FArrayBox> **)((long)x->content + 8);
  this_00 = *(FabArray<amrex::FArrayBox> **)((long)a->content + 8);
  this_01 = *(MultiFab **)((long)m->content + 8);
  uVar2 = (this->super_FabArrayBase).n_comp;
  amrex::MFIter::MFIter(&local_90,&this->super_FabArrayBase,'\0');
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  while (local_90.currentIndex < local_90.endIndex) {
    amrex::MFIter::validbox(&local_16c,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_110,this_00,&local_90);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_150,this_00,&local_90);
    lVar8 = (long)local_16c.smallend.vect[1];
    lVar3 = (long)local_16c.smallend.vect[2];
    lVar13 = (long)local_16c.smallend.vect[0];
    lVar6 = (lVar8 - local_d0.begin.y) * local_d0.jstride * 8 +
            (lVar3 - local_d0.begin.z) * local_d0.kstride * 8 + lVar13 * 8 +
            (long)local_d0.begin.x * -8 + (long)local_d0.p;
    lVar15 = (lVar8 - local_110.begin.y) * local_110.jstride * 8 +
             (lVar3 - local_110.begin.z) * local_110.kstride * 8 + lVar13 * 8 +
             (long)local_110.begin.x * -8 + (long)local_110.p;
    lVar13 = (lVar8 - local_150.begin.y) * local_150.jstride * 8 +
             (lVar3 - local_150.begin.z) * local_150.kstride * 8 + lVar13 * 8 +
             (long)local_150.begin.x * -8 + (long)local_150.p;
    for (uVar10 = 0; lVar4 = lVar13, lVar9 = lVar3, lVar11 = lVar6, lVar16 = lVar15, uVar10 != uVar2
        ; uVar10 = uVar10 + 1) {
      for (; lVar5 = lVar11, lVar7 = lVar4, lVar12 = lVar8, lVar17 = lVar16,
          lVar9 <= local_16c.bigend.vect[2]; lVar9 = lVar9 + 1) {
        for (; lVar12 <= local_16c.bigend.vect[1]; lVar12 = lVar12 + 1) {
          if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
            lVar14 = 0;
            do {
              *(undefined8 *)(lVar7 + lVar14 * 8) = 0;
              dVar1 = *(double *)(lVar17 + lVar14 * 8);
              if ((dVar1 != 0.0) || (NAN(dVar1))) {
                dVar18 = dVar1 * *(double *)(lVar5 + lVar14 * 8);
                if (((1.5 < ABS(dVar1)) && (dVar18 <= 0.0)) ||
                   ((0.5 < ABS(dVar1) && (dVar18 < 0.0)))) {
                  *(undefined8 *)(lVar7 + lVar14 * 8) = 0x3ff0000000000000;
                }
              }
              lVar14 = lVar14 + 1;
            } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 != (int)lVar14);
          }
          lVar5 = lVar5 + local_d0.jstride * 8;
          lVar17 = lVar17 + local_110.jstride * 8;
          lVar7 = lVar7 + local_150.jstride * 8;
        }
        lVar4 = lVar4 + local_150.kstride * 8;
        lVar11 = lVar11 + local_d0.kstride * 8;
        lVar16 = lVar16 + local_110.kstride * 8;
      }
      lVar6 = lVar6 + local_d0.nstride * 8;
      lVar15 = lVar15 + local_110.nstride * 8;
      lVar13 = lVar13 + local_150.nstride * 8;
    }
    amrex::MFIter::operator++(&local_90);
  }
  amrex::MFIter::~MFIter(&local_90);
  RVar19 = amrex::MultiFab::norm1(this_01,0,0,false);
  return -(uint)(RVar19 != 1.0) & 1;
}

Assistant:

int N_VConstrMask_MultiFab(N_Vector a, N_Vector x, N_Vector m)
{
    using namespace amrex;

    amrex::MultiFab *mf_x = amrex::sundials::getMFptr(x);
    amrex::MultiFab *mf_a = amrex::sundials::getMFptr(a);
    amrex::MultiFab *mf_m = amrex::sundials::getMFptr(m);
    sunindextype ncomp = mf_x->nComp();

    // ghost cells not included
    amrex::Real temp = amrex::Real(0.0);
    for (MFIter mfi(*mf_x); mfi.isValid(); ++mfi) {
        const amrex::Box& bx = mfi.validbox();
        Array4<Real> const& x_fab = mf_x->array(mfi);
        Array4<Real> const& a_fab = mf_a->array(mfi);
        Array4<Real> const& m_fab = mf_a->array(mfi);
        //Changing continue to if check, temp calculation should be changed to reduction
        amrex::ParallelFor(bx, ncomp,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int c) noexcept
            {
                m_fab(i,j,k,c) = amrex::Real(0.0);

                /* Continue if no constraints were set for the variable */
                if (a_fab(i,j,k,c) != amrex::Real(0.0)) {

                    /* Check if a set constraint has been violated */
                    amrex::Real a, x;
                    a = a_fab(i,j,k,c);
                    x = x_fab(i,j,k,c);
                    int test = (SUNRabs(a) > amrex::Real(1.5) && x*a <= amrex::Real(0.0)) ||
                        (SUNRabs(a) > amrex::Real(0.5)   && x*a <  amrex::Real(0.0));
                    if (test) {
                        m_fab(i,j,k,c) = amrex::Real(1.0);
                    }
                }
            });
    }

    temp = mf_m->norm1();
    /* Return false if any constraint was violated */
    amrex::ParallelDescriptor::ReduceRealMax(temp);

    return (temp == amrex::Real(1.0)) ? SUNFALSE : SUNTRUE;
}